

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

ND_BOOL ShemuX86CheckDiv(ND_UINT64 Divident,ND_UINT64 Divider,ND_UINT8 Size)

{
  ND_UINT8 Size_local;
  ND_UINT64 Divider_local;
  ND_UINT64 Divident_local;
  
  if (Divider == 0) {
    return '\0';
  }
  if (Size == '\x01') {
    if (Divider <= (Divident >> 8 & 0xff)) {
      return '\0';
    }
  }
  else if (Size == '\x02') {
    if (Divider <= (Divident >> 0x10 & 0xffff)) {
      return '\0';
    }
  }
  else {
    if (Size != '\x04') {
      return '\0';
    }
    if (Divider <= Divident >> 0x20) {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

static ND_BOOL
ShemuX86CheckDiv(
    ND_UINT64 Divident,
    ND_UINT64 Divider,
    ND_UINT8 Size            // The size of the Source (Divider). The Divident is twice as large.
    )
{
    // Returns ND_TRUE if all checks are OK, and Divident / Divider will not cause #DE.

    if (Divider == 0)
    {
        // Division by zero.
        return ND_FALSE;
    }

    // If the result won't fit in the destination, a #DE would be generated.
    switch (Size)
    {
    case 1:
        if (((Divident >> 8) & 0xFF) >= Divider)
        {
            return ND_FALSE;
        }
        break;

    case 2:
        if (((Divident >> 16) & 0xFFFF) >= Divider)
        {
            return ND_FALSE;
        }
        break;

    case 4:
        if (((Divident >> 32) & 0xFFFFFFFF) >= Divider)
        {
            return ND_FALSE;
        }
        break;

    default:
        // 64 bit source division is not supported.
        return ND_FALSE;
    }

    return ND_TRUE;
}